

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

bool __thiscall ON_Font::SetAppleFontWeightTrait(ON_Font *this,double apple_font_weight_trait)

{
  double apple_font_weight_trait_00;
  bool bVar1;
  Weight font_weight_00;
  undefined1 local_30 [23];
  Weight font_weight;
  double apple_font_weight_trait_local;
  ON_Font *this_local;
  
  unique0x1000009b = apple_font_weight_trait;
  apple_font_weight_trait_local = (double)this;
  bVar1 = ON_IsValid(apple_font_weight_trait);
  if (bVar1) {
    font_weight_00 = WeightFromAppleFontWeightTrait(stack0xffffffffffffffe0);
    apple_font_weight_trait_00 = stack0xffffffffffffffe0;
    local_30[0xf] = font_weight_00;
    PostScriptName((ON_Font *)local_30);
    bVar1 = ON_wString::IsEmpty((ON_wString *)local_30);
    this_local._7_1_ =
         Internal_SetFontWeightTrio(this,font_weight_00,-1,apple_font_weight_trait_00,bVar1);
    ON_wString::~ON_wString((ON_wString *)local_30);
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ON_Font::SetAppleFontWeightTrait(
  double apple_font_weight_trait
)
{
  if (false == ON_IsValid(apple_font_weight_trait))
    return false; // nan or unset value

  const ON_Font::Weight font_weight = ON_Font::WeightFromAppleFontWeightTrait(apple_font_weight_trait);

  return Internal_SetFontWeightTrio(
    font_weight, 
    -1, 
    apple_font_weight_trait,
    PostScriptName().IsEmpty()
  );
}